

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O0

void testMultiPartThreading(string *tempDir)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  exception *e;
  int numThreads;
  string *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int partNumber;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing the multi part APIs for multi-thread use")
  ;
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar1 = IlmThread_3_2::supportsThreads();
  partNumber = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    random_reseed(0);
    IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::numThreads();
    iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
    anon_unknown.dwarf_18c49e::testWriteRead
              (partNumber,in_stack_ffffffffffffffd0,iVar3,in_stack_ffffffffffffffc0);
    anon_unknown.dwarf_18c49e::testWriteRead
              (partNumber,in_stack_ffffffffffffffd0,iVar3,in_stack_ffffffffffffffc0);
    anon_unknown.dwarf_18c49e::testWriteRead
              (partNumber,in_stack_ffffffffffffffd0,iVar3,in_stack_ffffffffffffffc0);
    anon_unknown.dwarf_18c49e::testWriteRead
              (partNumber,in_stack_ffffffffffffffd0,iVar3,in_stack_ffffffffffffffc0);
    iVar3 = IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::setNumThreads(iVar3);
    poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
testMultiPartThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing the multi part APIs for multi-thread use" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }
#if ILMTHREAD_THREADING_ENABLED
        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (32);

        testWriteRead (1, 1, 5, tempDir);
        testWriteRead (2, 2, 10, tempDir);
        testWriteRead (5, 5, 25, tempDir);
        testWriteRead (50, 2, 250, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);
#endif
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}